

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

tribool __thiscall
libtorrent::aux::torrent::on_blocks_hashed
          (torrent *this,piece_index_t piece,span<const_libtorrent::digest32<256L>_> block_hashes)

{
  hash_picker *this_00;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> _Var1;
  pointer piVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  file_storage *this_01;
  char *__s;
  char *pcVar8;
  uint uVar9;
  torrent *ptVar10;
  char *pcVar11;
  long lVar13;
  uint uVar14;
  value_t vVar15;
  digest32<256L> *this_02;
  ulong *puVar16;
  char *pcVar17;
  ulong __n;
  int iVar18;
  piece_index_t pVar19;
  ulong uVar20;
  set_block_hash_result sVar21;
  ulong local_a8;
  digest32<256L> *local_a0;
  vector<int,_std::allocator<int>_> local_98;
  ulong local_78;
  char *local_70;
  uint local_64;
  ulong local_60;
  char *local_58;
  int local_4c;
  value_t local_48;
  int local_44;
  ulong local_40;
  torrent *local_38;
  ulong uVar7;
  uint uVar12;
  
  local_a0 = block_hashes.m_ptr;
  puVar16 = &local_a8;
  need_hash_picker(this);
  this_01 = torrent_info::orig_files
                      ((this->super_torrent_hot_members).m_torrent_file.
                       super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
  local_40 = (ulong)(uint)piece.m_val;
  iVar4 = file_storage::blocks_in_piece2(this_01,piece);
  local_38 = this;
  local_4c = file_storage::blocks_per_piece
                       (&((this->super_torrent_hot_members).m_torrent_file.
                          super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->m_files);
  __n = (ulong)iVar4;
  if (iVar4 < 0x1001) {
    if (0 < iVar4) {
      puVar16 = (ulong *)((long)&local_a8 - (__n + 0xf & 0x1fffffff0));
      __s = (char *)puVar16;
      goto LAB_00313ab3;
    }
    __s = (char *)0x0;
    __n = 0;
    pcVar8 = (char *)0x0;
    pcVar17 = (char *)0x0;
  }
  else {
    __s = (char *)operator_new__(__n);
    puVar16 = &local_a8;
LAB_00313ab3:
    local_44 = iVar4;
    if (iVar4 != 0) {
      *(char *)((long)puVar16 + -8) = -0x39;
      *(char *)((long)puVar16 + -7) = ':';
      *(char *)((long)puVar16 + -6) = '1';
      *(char *)((long)puVar16 + -5) = '\0';
      *(char *)((long)puVar16 + -4) = '\0';
      *(char *)((long)puVar16 + -3) = '\0';
      *(char *)((long)puVar16 + -2) = '\0';
      *(char *)((long)puVar16 + -1) = '\0';
      memset(__s,0,__n);
    }
    local_70 = __s + __n;
    local_48 = indeterminate_value;
    uVar20 = 0;
    local_60 = __n;
    local_58 = __s;
    do {
      this_02 = local_a0 + uVar20;
      *(char *)((long)puVar16 + -8) = -9;
      *(char *)((long)puVar16 + -7) = ':';
      *(char *)((long)puVar16 + -6) = '1';
      *(char *)((long)puVar16 + -5) = '\0';
      *(char *)((long)puVar16 + -4) = '\0';
      *(char *)((long)puVar16 + -3) = '\0';
      *(char *)((long)puVar16 + -2) = '\0';
      *(char *)((long)puVar16 + -1) = '\0';
      bVar3 = digest32<256L>::is_all_zeros(this_02);
      uVar7 = local_40;
      if (bVar3) goto LAB_00313ce8;
      this_00 = (local_38->super_torrent_hot_members).m_hash_picker._M_t.
                super___uniq_ptr_impl<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
                ._M_t.
                super__Tuple_impl<0UL,_libtorrent::aux::hash_picker_*,_std::default_delete<libtorrent::aux::hash_picker>_>
                .super__Head_base<0UL,_libtorrent::aux::hash_picker_*,_false>._M_head_impl;
      builtin_strncpy((char *)((long)puVar16 + -8),"\x19;1",4);
      *(char *)((long)puVar16 + -4) = '\0';
      *(char *)((long)puVar16 + -3) = '\0';
      *(char *)((long)puVar16 + -2) = '\0';
      *(char *)((long)puVar16 + -1) = '\0';
      sVar21 = hash_picker::set_block_hash
                         (this_00,(piece_index_t)(int)uVar7,(int)uVar20 << 0xe,this_02);
      uVar12 = sVar21.num_verified;
      uVar7 = sVar21._0_8_;
      if (sVar21.status == block_hash_failed) {
        local_48 = false_value;
      }
      else if (sVar21.status == success) {
        local_78 = uVar7;
        uVar14 = sVar21.first_verified_block;
        uVar9 = 0;
        if (uVar14 != 0 && -1 < (long)uVar7) {
          uVar9 = uVar14;
        }
        uVar5 = local_44 - uVar9;
        if ((int)uVar12 < (int)(local_44 - uVar9)) {
          uVar5 = uVar12;
        }
        if (0 < (int)uVar5) {
          builtin_strncpy((char *)((long)puVar16 + -8),"c;1",4);
          *(char *)((long)puVar16 + -4) = '\0';
          *(char *)((long)puVar16 + -3) = '\0';
          *(char *)((long)puVar16 + -2) = '\0';
          *(char *)((long)puVar16 + -1) = '\0';
          memset(__s + uVar9,1,(ulong)uVar5);
        }
        iVar4 = (int)uVar12 / local_4c;
        if (iVar4 != 0) {
          local_64 = uVar12;
          iVar6 = (int)((long)((ulong)(uint)((int)uVar14 >> 0x1f) << 0x20 | uVar7 >> 0x20) /
                       (long)local_4c);
          local_a8 = (ulong)(uint)((int)local_40 + iVar6);
          iVar18 = 0;
          ptVar10 = local_38;
          do {
            _Var1._M_head_impl =
                 (ptVar10->super_torrent_hot_members).m_picker._M_t.
                 super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                 .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl;
            if ((_Var1._M_head_impl != (piece_picker *)0x0) && (-iVar6 != iVar18)) {
              pVar19.m_val = (int)local_a8 + iVar18;
              *(char *)((long)puVar16 + -8) = -0x46;
              *(char *)((long)puVar16 + -7) = ';';
              *(char *)((long)puVar16 + -6) = '1';
              *(char *)((long)puVar16 + -5) = '\0';
              *(char *)((long)puVar16 + -4) = '\0';
              *(char *)((long)puVar16 + -3) = '\0';
              *(char *)((long)puVar16 + -2) = '\0';
              *(char *)((long)puVar16 + -1) = '\0';
              bVar3 = piece_picker::is_piece_finished(_Var1._M_head_impl,pVar19);
              ptVar10 = local_38;
              if (bVar3) {
                _Var1._M_head_impl =
                     (local_38->super_torrent_hot_members).m_picker._M_t.
                     super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                     .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl;
                *(char *)((long)puVar16 + -8) = -0x32;
                *(char *)((long)puVar16 + -7) = ';';
                *(char *)((long)puVar16 + -6) = '1';
                *(char *)((long)puVar16 + -5) = '\0';
                *(char *)((long)puVar16 + -4) = '\0';
                *(char *)((long)puVar16 + -3) = '\0';
                *(char *)((long)puVar16 + -2) = '\0';
                *(char *)((long)puVar16 + -1) = '\0';
                bVar3 = piece_picker::has_piece_passed(_Var1._M_head_impl,pVar19);
                ptVar10 = local_38;
                if (!bVar3) {
                  _Var1._M_head_impl =
                       (local_38->super_torrent_hot_members).m_picker._M_t.
                       super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                       .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl;
                  *(char *)((long)puVar16 + -8) = -0x1e;
                  *(char *)((long)puVar16 + -7) = ';';
                  *(char *)((long)puVar16 + -6) = '1';
                  *(char *)((long)puVar16 + -5) = '\0';
                  *(char *)((long)puVar16 + -4) = '\0';
                  *(char *)((long)puVar16 + -3) = '\0';
                  *(char *)((long)puVar16 + -2) = '\0';
                  *(char *)((long)puVar16 + -1) = '\0';
                  piece_picker::we_have(_Var1._M_head_impl,pVar19);
                  ptVar10 = local_38;
                  *(char *)((long)puVar16 + -8) = -0x15;
                  *(char *)((long)puVar16 + -7) = ';';
                  *(char *)((long)puVar16 + -6) = '1';
                  *(char *)((long)puVar16 + -5) = '\0';
                  *(char *)((long)puVar16 + -4) = '\0';
                  *(char *)((long)puVar16 + -3) = '\0';
                  *(char *)((long)puVar16 + -2) = '\0';
                  *(char *)((long)puVar16 + -1) = '\0';
                  update_gauge(ptVar10);
                  ptVar10 = local_38;
                  *(char *)((long)puVar16 + -8) = -7;
                  *(char *)((long)puVar16 + -7) = ';';
                  *(char *)((long)puVar16 + -6) = '1';
                  *(char *)((long)puVar16 + -5) = '\0';
                  *(char *)((long)puVar16 + -4) = '\0';
                  *(char *)((long)puVar16 + -3) = '\0';
                  *(char *)((long)puVar16 + -2) = '\0';
                  *(char *)((long)puVar16 + -1) = '\0';
                  we_have(ptVar10,pVar19,false);
                  ptVar10 = local_38;
                }
              }
            }
            iVar18 = iVar18 + 1;
            __s = local_58;
            uVar12 = local_64;
          } while (iVar4 != iVar18);
        }
        sVar21.num_verified = uVar12;
        sVar21.status = (undefined4)local_78;
        sVar21.first_verified_block = local_78._4_4_;
        __n = local_60;
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != __n);
    if (sVar21.status == piece_hash_failed) {
      iVar4 = sVar21.first_verified_block / local_4c;
      iVar6 = sVar21.num_verified / local_4c;
      if (iVar6 == 0) {
LAB_00313ce8:
        vVar15 = false_value;
      }
      else {
        local_40 = (ulong)(uint)((int)local_40 + iVar4);
        iVar18 = 0;
        ptVar10 = local_38;
        do {
          _Var1._M_head_impl =
               (ptVar10->super_torrent_hot_members).m_picker._M_t.
               super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
               ._M_t.
               super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
               .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl;
          if ((_Var1._M_head_impl != (piece_picker *)0x0) && (-iVar4 != iVar18)) {
            pVar19.m_val = (int)local_40 + iVar18;
            *(char *)((long)puVar16 + -8) = -0x7b;
            *(char *)((long)puVar16 + -7) = '<';
            *(char *)((long)puVar16 + -6) = '1';
            *(char *)((long)puVar16 + -5) = '\0';
            *(char *)((long)puVar16 + -4) = '\0';
            *(char *)((long)puVar16 + -3) = '\0';
            *(char *)((long)puVar16 + -2) = '\0';
            *(char *)((long)puVar16 + -1) = '\0';
            piece_picker::we_dont_have(_Var1._M_head_impl,pVar19);
            *(char *)((long)puVar16 + -8) = -0x73;
            *(char *)((long)puVar16 + -7) = '<';
            *(char *)((long)puVar16 + -6) = '1';
            *(char *)((long)puVar16 + -5) = '\0';
            *(char *)((long)puVar16 + -4) = '\0';
            *(char *)((long)puVar16 + -3) = '\0';
            *(char *)((long)puVar16 + -2) = '\0';
            *(char *)((long)puVar16 + -1) = '\0';
            update_gauge(ptVar10);
            local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
            local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)0x0;
            local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)0x0;
            *(char *)((long)puVar16 + -8) = -0x4f;
            *(char *)((long)puVar16 + -7) = '<';
            *(char *)((long)puVar16 + -6) = '1';
            *(char *)((long)puVar16 + -5) = '\0';
            *(char *)((long)puVar16 + -4) = '\0';
            *(char *)((long)puVar16 + -3) = '\0';
            *(char *)((long)puVar16 + -2) = '\0';
            *(char *)((long)puVar16 + -1) = '\0';
            piece_failed(ptVar10,pVar19,&local_98);
            __n = local_60;
            piVar2 = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            ptVar10 = local_38;
            if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              uVar20 = (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage -
                       (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start;
              *(char *)((long)puVar16 + -8) = -0x2f;
              *(char *)((long)puVar16 + -7) = '<';
              *(char *)((long)puVar16 + -6) = '1';
              *(char *)((long)puVar16 + -5) = '\0';
              *(char *)((long)puVar16 + -4) = '\0';
              *(char *)((long)puVar16 + -3) = '\0';
              *(char *)((long)puVar16 + -2) = '\0';
              *(char *)((long)puVar16 + -1) = '\0';
              operator_delete(piVar2,uVar20);
              ptVar10 = local_38;
            }
          }
          iVar18 = iVar18 + 1;
        } while (iVar6 != iVar18);
        __s = local_58;
        vVar15 = false_value;
      }
      goto LAB_00313da6;
    }
    vVar15 = local_48;
    if (local_48 != indeterminate_value) goto LAB_00313da6;
    pcVar8 = __s;
    pcVar17 = local_70;
    if (0 < (long)__n >> 2) {
      pcVar8 = __s + (__n & 0xfffffffffffffffc);
      lVar13 = ((long)__n >> 2) + 1;
      pcVar11 = __s + 3;
      do {
        if (pcVar11[-3] != '\x01') {
          pcVar11 = pcVar11 + -3;
          goto LAB_00313d9c;
        }
        if (pcVar11[-2] != '\x01') {
          pcVar11 = pcVar11 + -2;
          goto LAB_00313d9c;
        }
        if (pcVar11[-1] != '\x01') {
          pcVar11 = pcVar11 + -1;
          goto LAB_00313d9c;
        }
        if (*pcVar11 != '\x01') goto LAB_00313d9c;
        lVar13 = lVar13 + -1;
        pcVar11 = pcVar11 + 4;
      } while (1 < lVar13);
    }
  }
  lVar13 = (long)pcVar17 - (long)pcVar8;
  vVar15 = true_value;
  if (lVar13 == 1) {
LAB_00313d8b:
    pcVar11 = pcVar8;
    if (*pcVar8 != '\0') goto LAB_00313da6;
  }
  else if (lVar13 == 2) {
LAB_00313d83:
    pcVar11 = pcVar8;
    if (*pcVar8 == '\x01') {
      pcVar8 = pcVar8 + 1;
      goto LAB_00313d8b;
    }
  }
  else {
    if (lVar13 != 3) goto LAB_00313da6;
    pcVar11 = pcVar8;
    if (*pcVar8 == '\x01') {
      pcVar8 = pcVar8 + 1;
      goto LAB_00313d83;
    }
  }
LAB_00313d9c:
  vVar15 = (pcVar11 != pcVar17) + true_value;
LAB_00313da6:
  if ((0x1000 < (long)__n) && (__s != (char *)0x0)) {
    *(undefined8 *)((long)puVar16 + -8) = 0x313dbc;
    operator_delete__(__s);
  }
  return (tribool)vVar15;
}

Assistant:

boost::tribool torrent::on_blocks_hashed(piece_index_t const piece
		, span<sha256_hash const> const block_hashes)
	{
		boost::tribool ret = boost::indeterminate;
		need_hash_picker();

		int const blocks_in_piece = torrent_file().orig_files().blocks_in_piece2(piece);
		int const blocks_per_piece = torrent_file().blocks_per_piece();

		// the blocks are guaranteed to represent exactly one piece
		TORRENT_ASSERT(blocks_in_piece == int(block_hashes.size()));

		TORRENT_ALLOCA(block_passed, bool, blocks_in_piece);
		std::fill(block_passed.begin(), block_passed.end(), false);

		auto last_result = set_block_hash_result(set_block_hash_result::result::unknown);

		for (int i = 0; i < blocks_in_piece; ++i)
		{
			// if there was an enoent or eof error the block hashes array may be incomplete
			// bail if we've hit the end of the valid hashes
			if (block_hashes[i].is_all_zeros()) return false;

			auto const result = get_hash_picker().set_block_hash(piece
				, i * default_block_size, block_hashes[i]);
			last_result = result;

			// all verified ranges should always be full pieces or less
			TORRENT_ASSERT(result.first_verified_block >= 0
				|| (result.first_verified_block % blocks_per_piece) == 0);
			TORRENT_ASSERT(result.num_verified <= blocks_per_piece
				|| (result.num_verified % blocks_per_piece) == 0);

			if (result.status == set_block_hash_result::result::success)
			{
				TORRENT_ASSERT(result.first_verified_block < blocks_in_piece);
				TORRENT_ASSERT(blocks_in_piece <= blocks_per_piece);

				// note that result.num_verified may cover pad blocks too, and
				// so may be > blocks_in_piece

				// sometimes, completing a single block may "unlock" validating
				// multiple pieces. e.g. if we don't have the piece layer yet,
				// but we completed the last block in the whole torrent, now we
				// can validate everything. For this reason,
				// first_verified_block may be negative.

				// In this call, we track the blocks in this piece though, in
				// the block_passed array. For that tracking we need to clamp
				// the start index to 0.
				auto const first_block = std::max(0, result.first_verified_block);
				auto const count = std::min(blocks_in_piece - first_block, result.num_verified);
				std::fill_n(block_passed.begin() + first_block, count, true);

				// the current block (i) should be part of the range that was
				// verified
				TORRENT_ASSERT(first_block <= i);
				TORRENT_ASSERT(i < first_block + count);

				// if the hashes for more than one piece have been verified,
				// check for any pieces which were already checked but couldn't
				// be verified and mark them as verified
				for (piece_index_t verified_piece : result.piece_range(piece, blocks_per_piece))
				{
					if (!has_picker()
						|| verified_piece == piece
						|| !m_picker->is_piece_finished(verified_piece)
						|| m_picker->has_piece_passed(verified_piece))
						continue;

					TORRENT_ASSERT(get_hash_picker().piece_verified(verified_piece));
					m_picker->we_have(verified_piece);
					update_gauge();
					we_have(verified_piece);
				}
			}
			else if (result.status == set_block_hash_result::result::block_hash_failed)
			{
				ret = false;
			}
		}
		if (last_result.status == set_block_hash_result::result::piece_hash_failed)
		{
			// only if the *last* block causes the piece to fail, do we know
			// it actually failed. Otherwise it might have been failing
			// because of other, previously existing block hashes.
			ret = false;

			// if the hashes for more than one piece have been verified,
			// check for any pieces which were already checked but couldn't
			// be verified and mark them as verified
			for (piece_index_t verified_piece : last_result.piece_range(piece, blocks_per_piece))
			{
				if (!has_picker()
					|| verified_piece == piece)
					continue;

				m_picker->we_dont_have(verified_piece);
				update_gauge();
				piece_failed(verified_piece);
			}
		}

		if (boost::indeterminate(ret) && std::all_of(block_passed.begin(), block_passed.end()
			, [](bool e) { return e; }))
		{
			ret = true;
		}
		return ret;
	}